

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

us_socket_t * us_socket_close(int ssl,us_socket_t *s)

{
  int iVar1;
  us_internal_ssl_socket_t *in_RSI;
  int in_EDI;
  us_loop_t *in_stack_fffffffffffffff8;
  
  if (in_EDI == 0) {
    iVar1 = us_socket_is_closed(0,&in_RSI->s);
    if (iVar1 == 0) {
      us_internal_socket_context_unlink((in_RSI->s).context,&in_RSI->s);
      us_poll_stop(&s->p,in_stack_fffffffffffffff8);
      us_poll_fd((us_poll_t *)in_RSI);
      bsd_close_socket(0);
      (in_RSI->s).next = (((in_RSI->s).context)->loop->data).closed_head;
      (((in_RSI->s).context)->loop->data).closed_head = &in_RSI->s;
      (in_RSI->s).prev = (us_socket_t *)(in_RSI->s).context;
      in_RSI = (us_internal_ssl_socket_t *)(*((in_RSI->s).context)->on_close)(&in_RSI->s);
    }
  }
  else {
    in_RSI = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)0x1068ac);
  }
  return &in_RSI->s;
}

Assistant:

struct us_socket_t *us_socket_close(int ssl, struct us_socket_t *s) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_close((struct us_internal_ssl_socket_t *) s);
    }
#endif

    if (!us_socket_is_closed(0, s)) {
        us_internal_socket_context_unlink(s->context, s);
        us_poll_stop((struct us_poll_t *) s, s->context->loop);
        bsd_close_socket(us_poll_fd((struct us_poll_t *) s));

        /* Link this socket to the close-list and let it be deleted after this iteration */
        s->next = s->context->loop->data.closed_head;
        s->context->loop->data.closed_head = s;

        /* Any socket with prev = context is marked as closed */
        s->prev = (struct us_socket_t *) s->context;

        return s->context->on_close(s);
    }
    return s;
}